

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

int TraceFd(void)

{
  int fd;
  char *pcVar1;
  time_t tVar2;
  char *__file;
  
  if (TraceFd::trace_fd == -1) {
    pcVar1 = getenv("TCMALLOC_TRACE_FILE");
    __file = "/tmp/google.alloc";
    if (pcVar1 != (char *)0x0) {
      __file = pcVar1;
    }
    TraceFd::trace_fd = open(__file,0x241,0x1b6);
    if (TraceFd::trace_fd == -1) {
      if (pcVar1 == (char *)0x0) {
        TraceFd::trace_fd = 2;
        pcVar1 = "Can\'t open %s.  Logging to stderr.\n";
      }
      else {
        pcVar1 = "Can\'t open %s.  Logging disabled.\n";
      }
      TracePrintf(2,pcVar1,__file);
    }
    fd = TraceFd::trace_fd;
    tVar2 = time((time_t *)0x0);
    TracePrintf(fd,"Trace started: %lu\n",tVar2);
    TracePrintf(TraceFd::trace_fd,"func\tsize\tptr\tthread_id\tstack pcs for tools/symbolize\n");
  }
  return TraceFd::trace_fd;
}

Assistant:

static int TraceFd() {
  static int trace_fd = -1;
  if (trace_fd == -1) {            // Open the trace file on the first call
    const char *val = getenv("TCMALLOC_TRACE_FILE");
    bool fallback_to_stderr = false;
    if (!val) {
      val = "/tmp/google.alloc";
      fallback_to_stderr = true;
    }
    trace_fd = open(val, O_CREAT|O_TRUNC|O_WRONLY, 0666);
    if (trace_fd == -1) {
      if (fallback_to_stderr) {
        trace_fd = 2;
        TracePrintf(trace_fd, "Can't open %s.  Logging to stderr.\n", val);
      } else {
        TracePrintf(2, "Can't open %s.  Logging disabled.\n", val);
      }
    }
    // Add a header to the log.
    TracePrintf(trace_fd, "Trace started: %lu\n",
                static_cast<unsigned long>(time(nullptr)));
    TracePrintf(trace_fd,
                "func\tsize\tptr\tthread_id\tstack pcs for tools/symbolize\n");
  }
  return trace_fd;
}